

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ReportUnknown
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece message)

{
  stringpiece_ssize_type sVar1;
  StringPiece message_00;
  char *local_b8;
  undefined8 local_b0;
  AlphaNum local_88;
  StringPiece local_58;
  string local_48;
  
  local_88.piece_size_ = message.length_;
  local_88.piece_data_ = message.ptr_;
  if (this->finishing_ == false) {
    StringPiece::StringPiece(&local_58,"");
    Status::Status(__return_storage_ptr__,CANCELLED,local_58);
  }
  else if ((this->p_).length_ == 0) {
    local_b8 = "Unexpected end of string. ";
    local_b0 = 0x1a;
    StrCat_abi_cxx11_(&local_48,(protobuf *)&local_b8,&local_88,(AlphaNum *)local_88.piece_size_);
    sVar1 = StringPiece::CheckedSsizeTFromSizeT(local_48._M_string_length);
    message_00.length_ = sVar1;
    message_00.ptr_ = local_48._M_dataplus._M_p;
    ReportFailure(__return_storage_ptr__,this,message_00);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    ReportFailure(__return_storage_ptr__,this,message);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ReportUnknown(StringPiece message) {
  // If we aren't finishing the parse, cancel parsing and try later.
  if (!finishing_) {
    return util::Status(util::error::CANCELLED, "");
  }
  if (p_.empty()) {
    return ReportFailure(StrCat("Unexpected end of string. ", message));
  }
  return ReportFailure(message);
}